

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFboRenderTest.cpp
# Opt level: O1

void __thiscall
deqp::gles3::Functional::Framebuffer::Framebuffer
          (Framebuffer *this,Context *context,FboConfig *config,int width,int height,deUint32 fbo,
          deUint32 colorBufferName,deUint32 depthStencilBufferName)

{
  GLenum GVar1;
  int iVar2;
  int iVar3;
  GLenum GVar4;
  GLenum GVar5;
  deUint32 dVar6;
  Error *this_00;
  TestError *this_01;
  uint uVar7;
  ulong uVar8;
  int iVar9;
  string local_60;
  code *local_40;
  int local_38;
  
  dVar6 = config->buffers;
  GVar1 = config->colorType;
  GVar4 = config->colorFormat;
  GVar5 = config->depthStencilType;
  iVar9 = config->width;
  iVar2 = config->height;
  iVar3 = config->samples;
  (this->m_config).depthStencilFormat = config->depthStencilFormat;
  (this->m_config).width = iVar9;
  (this->m_config).height = iVar2;
  (this->m_config).samples = iVar3;
  (this->m_config).buffers = dVar6;
  (this->m_config).colorType = GVar1;
  (this->m_config).colorFormat = GVar4;
  (this->m_config).depthStencilType = GVar5;
  this->m_context = context;
  this->m_framebuffer = fbo;
  this->m_colorBuffer = 0;
  this->m_depthStencilBuffer = 0;
  checkColorFormatSupport(context,config->colorFormat);
  if (this->m_framebuffer == 0) {
    (*context->_vptr_Context[10])(context,1,&this->m_framebuffer);
  }
  (*context->_vptr_Context[9])(context,0x8d40,(ulong)this->m_framebuffer);
  if (((this->m_config).buffers & 0x4000) != 0) {
    GVar1 = (this->m_config).colorType;
    if (GVar1 == 0x8d41) {
      dVar6 = createRbo(this,colorBufferName,(this->m_config).colorFormat,width,height);
      this->m_colorBuffer = dVar6;
      (*context->_vptr_Context[0x20])(context,0x8d40,0x8ce0,0x8d41,(ulong)dVar6);
    }
    else {
      if (GVar1 != 0xde1) {
        this_01 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (this_01,"Unsupported type",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fFboRenderTest.cpp"
                   ,0x116);
        goto LAB_006a4922;
      }
      dVar6 = createTex2D(this,colorBufferName,(this->m_config).colorFormat,width,height);
      this->m_colorBuffer = dVar6;
      (*context->_vptr_Context[0x1e])(context,0x8d40,0x8ce0,0xde1,(ulong)dVar6,0);
    }
  }
  if (((this->m_config).buffers & 0x500) != 0) {
    GVar1 = (this->m_config).depthStencilType;
    if (GVar1 == 0x8d41) {
      dVar6 = createRbo(this,depthStencilBufferName,(this->m_config).depthStencilFormat,width,height
                       );
    }
    else {
      if (GVar1 != 0xde1) {
        this_01 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (this_01,"Unsupported type",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fFboRenderTest.cpp"
                   ,0x121);
LAB_006a4922:
        __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
      }
      dVar6 = createTex2D(this,depthStencilBufferName,(this->m_config).depthStencilFormat,width,
                          height);
    }
    this->m_depthStencilBuffer = dVar6;
  }
  iVar9 = 1;
  do {
    uVar7 = 0x400;
    if (iVar9 == 1) {
      uVar7 = 0x100;
    }
    if (((this->m_config).buffers & uVar7) != 0) {
      uVar8 = (ulong)((uint)(iVar9 != 1) << 5 | 0x8d00);
      GVar1 = (this->m_config).depthStencilType;
      if (GVar1 == 0x8d41) {
        (*context->_vptr_Context[0x20])
                  (context,0x8d40,uVar8,0x8d41,(ulong)this->m_depthStencilBuffer);
      }
      else if (GVar1 == 0xde1) {
        (*context->_vptr_Context[0x1e])
                  (context,0x8d40,uVar8,0xde1,(ulong)this->m_depthStencilBuffer,0);
      }
    }
    iVar9 = iVar9 + -1;
  } while (iVar9 == 0);
  iVar9 = (*this->m_context->_vptr_Context[0x79])();
  if (iVar9 == 0) {
    (*context->_vptr_Context[9])(context,0x8d40,0);
    return;
  }
  this_00 = (Error *)__cxa_allocate_exception(0x38);
  local_40 = glu::getErrorName;
  local_38 = iVar9;
  tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_60,&local_40);
  glu::Error::Error(this_00,iVar9,local_60._M_dataplus._M_p,"",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fFboRenderTest.cpp"
                    ,0x138);
  __cxa_throw(this_00,&glu::Error::typeinfo,glu::Error::~Error);
}

Assistant:

Framebuffer::Framebuffer (sglr::Context& context, const FboConfig& config, int width, int height, deUint32 fbo, deUint32 colorBufferName, deUint32 depthStencilBufferName)
	: m_config				(config)
	, m_context				(context)
	, m_framebuffer			(fbo)
	, m_colorBuffer			(0)
	, m_depthStencilBuffer	(0)
{
	// Verify that color format is supported
	checkColorFormatSupport(context, config.colorFormat);

	if (m_framebuffer == 0)
		context.genFramebuffers(1, &m_framebuffer);
	context.bindFramebuffer(GL_FRAMEBUFFER, m_framebuffer);

	if (m_config.buffers & (GL_COLOR_BUFFER_BIT))
	{
		switch (m_config.colorType)
		{
			case GL_TEXTURE_2D:
				m_colorBuffer = createTex2D(colorBufferName, m_config.colorFormat, width, height);
				context.framebufferTexture2D(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_2D, m_colorBuffer, 0);
				break;

			case GL_RENDERBUFFER:
				m_colorBuffer = createRbo(colorBufferName, m_config.colorFormat, width, height);
				context.framebufferRenderbuffer(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_RENDERBUFFER, m_colorBuffer);
				break;

			default:
				TCU_FAIL("Unsupported type");
		}
	}

	if (m_config.buffers & (GL_DEPTH_BUFFER_BIT|GL_STENCIL_BUFFER_BIT))
	{
		switch (m_config.depthStencilType)
		{
			case GL_TEXTURE_2D:		m_depthStencilBuffer = createTex2D(depthStencilBufferName, m_config.depthStencilFormat, width, height);		break;
			case GL_RENDERBUFFER:	m_depthStencilBuffer = createRbo(depthStencilBufferName, m_config.depthStencilFormat, width, height);		break;
			default:
				TCU_FAIL("Unsupported type");
		}
	}

	for (int ndx = 0; ndx < 2; ndx++)
	{
		deUint32	bit		= ndx ? GL_STENCIL_BUFFER_BIT : GL_DEPTH_BUFFER_BIT;
		deUint32	point	= ndx ? GL_STENCIL_ATTACHMENT : GL_DEPTH_ATTACHMENT;

		if ((m_config.buffers & bit) == 0)
			continue; /* Not used. */

		switch (m_config.depthStencilType)
		{
			case GL_TEXTURE_2D:		context.framebufferTexture2D(GL_FRAMEBUFFER, point, GL_TEXTURE_2D, m_depthStencilBuffer, 0);	break;
			case GL_RENDERBUFFER:	context.framebufferRenderbuffer(GL_FRAMEBUFFER, point, GL_RENDERBUFFER, m_depthStencilBuffer);	break;
			default:
				DE_ASSERT(false);
		}
	}

	GLenum err = m_context.getError();
	if (err != GL_NO_ERROR)
		throw glu::Error(err, glu::getErrorStr(err).toString().c_str(), "", __FILE__, __LINE__);

	context.bindFramebuffer(GL_FRAMEBUFFER, 0);
}